

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

int Abs_GiaCofPrint(word *pTruth,int nSize,int nSize0,int Res)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int Mark [2];
  int nStep;
  int nBits;
  int Bit;
  int i;
  int Res_local;
  int nSize0_local;
  int nSize_local;
  word *pTruth_local;
  
  Mark[1] = 1 << ((byte)nSize & 0x1f);
  Mark[0] = 1 << ((byte)nSize0 & 0x1f);
  bVar2 = true;
  bVar1 = true;
  nBits = 0;
  do {
    if (Mark[1] <= nBits) {
      printf("\n");
      if ((Res == 0) && ((!bVar1 || (!bVar2)))) {
        __assert_fail("Res || (Mark[0] && Mark[1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                      ,0x265,"int Abs_GiaCofPrint(word *, int, int, int)");
      }
      return 1;
    }
    if (nBits % Mark[0] == 0) {
      printf(" ");
      if ((Res == 0) && ((!bVar1 || (!bVar2)))) {
        __assert_fail("Res || (Mark[0] && Mark[1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                      ,0x25d,"int Abs_GiaCofPrint(word *, int, int, int)");
      }
      bVar2 = false;
      bVar1 = false;
    }
    uVar3 = Abc_InfoHasBit((uint *)pTruth,nBits);
    Mark[(long)(int)uVar3 + -2] = 1;
    printf("%d",(ulong)uVar3);
    nBits = nBits + 1;
  } while( true );
}

Assistant:

int Abs_GiaCofPrint( word * pTruth, int nSize, int nSize0, int Res )
{
    int i, Bit;
    int nBits = (1 << nSize);
    int nStep = (1 << nSize0);
    int Mark[2] = {1,1};
    for ( i = 0; i < nBits; i++ )
    {
        if ( i % nStep == 0 )
        {
            printf( " " );
            assert( Res || (Mark[0] && Mark[1]) );
            Mark[0] = Mark[1] = 0;
        }
        Bit = Abc_InfoHasBit((unsigned *)pTruth, i);
        Mark[Bit] = 1;
        printf( "%d", Bit );
    }
    printf( "\n" );
    assert( Res || (Mark[0] && Mark[1]) );
    return 1;
}